

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O0

QString * __thiscall QDBusMenuAdaptor::status(QDBusMenuAdaptor *this)

{
  bool bVar1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff88;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *file;
  undefined1 in_stack_ffffffffffffffa0 [16];
  QLatin1StringView in_stack_ffffffffffffffc0;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  file = in_RDI;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_RDI,in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xae8721);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffa0._0_8_,(char *)file,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff88,(char *)0xae8737);
    QMessageLogger::debug();
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)file,(size_t)in_RDI);
  QString::QString((QString *)QVar2.m_size,in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)file;
  }
  __stack_chk_fail();
}

Assistant:

QString QDBusMenuAdaptor::status() const
{
    qCDebug(qLcMenu);
    return "normal"_L1;
}